

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O2

void __thiscall
JetHead::vector<Regex::GroupData>::resize(vector<Regex::GroupData> *this,uint newSize)

{
  GroupData *pGVar1;
  ulong uVar2;
  ulong uVar3;
  uint newSize_00;
  long lVar4;
  ulong uVar5;
  
  uVar2 = (ulong)newSize;
  if (this->mAllocated < newSize) {
    newSize_00 = 0;
    if (this->mAllocated * 2 <= newSize) {
      newSize_00 = newSize;
    }
    sizeup(this,newSize_00);
  }
  lVar4 = uVar2 * 0x28 + 8;
  for (uVar5 = uVar2; uVar3 = (ulong)this->mSize, uVar5 < uVar3; uVar5 = uVar5 + 1) {
    std::__cxx11::string::~string((string *)((long)&this->mData->start_pos + lVar4));
    lVar4 = lVar4 + 0x28;
  }
  lVar4 = uVar3 * 0x28 + 0x18;
  for (; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    pGVar1 = this->mData;
    *(undefined8 *)((long)pGVar1 + lVar4 + -0x18) = 0;
    *(long *)((long)pGVar1 + lVar4 + -0x10) = (long)&pGVar1->start_pos + lVar4;
    *(undefined8 *)((long)pGVar1 + lVar4 + -8) = 0;
    *(undefined1 *)((long)&pGVar1->start_pos + lVar4) = 0;
    lVar4 = lVar4 + 0x28;
  }
  this->mSize = newSize;
  return;
}

Assistant:

void resize(unsigned newSize)
		{
			// If we need more allocation, do it now
			if (mAllocated < newSize)
			{
				if (newSize < mAllocated * 2)
				{
					sizeup();
				} else {
					sizeup(newSize);
				}
			}

			// If we are shrinking (newSize < mSize), destroy
			// everything that is now off the end of the vector
			for (unsigned i = newSize; i < mSize; i++)
			{
				mData[i].~T();
			}

			// If we are growing (mSize < newSize), then call the
			// default constructor on all the objects we just 
			// implicitly created
			for (unsigned i = mSize; i < newSize; i++)
			{
				new(mData + i) T();
			}
			
			// Remember our new size
			mSize = newSize;
		}